

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

int lyv_list_equal(void *val1_p,void *val2_p,int UNUSED_mod,void *UNUSED_cb_data)

{
  long *plVar1;
  long *elem;
  ly_ctx *ctx_00;
  long lVar2;
  lys_node *plVar3;
  int local_74;
  hash_table *phStack_70;
  int i;
  char *val2;
  char *val1;
  lyd_node *second;
  lyd_node *first;
  lyd_node *diter;
  lys_node *snode;
  lys_node_list *slist;
  ly_ctx *ctx;
  void *UNUSED_cb_data_local;
  int UNUSED_mod_local;
  void *val2_p_local;
  void *val1_p_local;
  
  if ((val1_p == (void *)0x0) || (val2_p == (void *)0x0)) {
    __assert_fail("val1_p && val2_p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x17a,"int lyv_list_equal(void *, void *, int, void *)");
  }
  plVar1 = *val1_p;
  elem = *val2_p;
  if ((plVar1 == (long *)0x0) || ((*(uint *)(*plVar1 + 0x38) & 0x18) == 0)) {
    __assert_fail("first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x17f,"int lyv_list_equal(void *, void *, int, void *)");
  }
  if ((elem == (long *)0x0) || (*elem != *plVar1)) {
    __assert_fail("second && (second->schema == first->schema)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x180,"int lyv_list_equal(void *, void *, int, void *)");
  }
  ctx_00 = (ly_ctx *)**(undefined8 **)(*plVar1 + 0x30);
  if (*(int *)(*plVar1 + 0x38) == 8) {
    if (((*(ushort *)(*plVar1 + 0x18) & 2) == 0) ||
       (((byte)(*(ushort *)(*(long *)(*plVar1 + 0x30) + 0x40) >> 1) & 7) < 2)) {
      if (plVar1[7] == elem[7]) {
        ly_vlog(ctx_00,LYE_DUPLEAFLIST,LY_VLOG_LYD,elem,*(undefined8 *)*elem,elem[7]);
        val1_p_local._4_4_ = 1;
      }
      else {
        val1_p_local._4_4_ = 0;
      }
    }
    else {
      val1_p_local._4_4_ = 0;
    }
  }
  else if (*(int *)(*plVar1 + 0x38) == 0x10) {
    lVar2 = *plVar1;
    if (*(char *)(lVar2 + 0x1e) == '\0') {
      val1_p_local._4_4_ = 0;
    }
    else {
      for (local_74 = 0; local_74 < (int)(uint)*(byte *)(lVar2 + 0x1e); local_74 = local_74 + 1) {
        plVar3 = *(lys_node **)(*(long *)(lVar2 + 0x88) + (long)local_74 * 8);
        phStack_70 = (hash_table *)0x0;
        val2 = (char *)0x0;
        for (first = (lyd_node *)plVar1[8]; first != (lyd_node *)0x0; first = first->next) {
          if (first->schema == plVar3) {
            val2 = (char *)first->ht;
            break;
          }
        }
        for (first = (lyd_node *)elem[8]; first != (lyd_node *)0x0; first = first->next) {
          if (first->schema == plVar3) {
            phStack_70 = first->ht;
            break;
          }
        }
        if ((hash_table *)val2 != phStack_70) {
          return 0;
        }
      }
      ly_vlog(ctx_00,LYE_DUPLIST,LY_VLOG_LYD,elem,*(undefined8 *)*elem);
      val1_p_local._4_4_ = 1;
    }
  }
  else {
    ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
           ,0x1b3);
    val1_p_local._4_4_ = 1;
  }
  return val1_p_local._4_4_;
}

Assistant:

static int
lyv_list_equal(void *val1_p, void *val2_p, int UNUSED(mod), void *UNUSED(cb_data))
{
    struct ly_ctx *ctx;
    struct lys_node_list *slist;
    const struct lys_node *snode = NULL;
    struct lyd_node *diter, *first, *second;
    const char *val1, *val2;
    int i;

    assert(val1_p && val2_p);

    first = *((struct lyd_node **)val1_p);
    second = *((struct lyd_node **)val2_p);

    assert(first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)));
    assert(second && (second->schema == first->schema));

    ctx = first->schema->module->ctx;

    switch (first->schema->nodetype) {
    case LYS_LEAFLIST:
        if ((first->schema->flags & LYS_CONFIG_R) && first->schema->module->version >= LYS_VERSION_1_1) {
            /* same values are allowed for status data */
            return 0;
        }
        /* compare values */
        if (ly_strequal(((struct lyd_node_leaf_list *)first)->value_str,
                        ((struct lyd_node_leaf_list *)second)->value_str, 1)) {
            LOGVAL(ctx, LYE_DUPLEAFLIST, LY_VLOG_LYD, second, second->schema->name,
                   ((struct lyd_node_leaf_list *)second)->value_str);
            return 1;
        }
        return 0;
    case LYS_LIST:
        slist = (struct lys_node_list *)first->schema;

        /* compare keys */
        if (!slist->keys_size) {
            /* status lists without keys */
            return 0;
        } else {
            for (i = 0; i < slist->keys_size; i++) {
                snode = (struct lys_node *)slist->keys[i];
                val1 = val2 = NULL;
                LY_TREE_FOR(first->child, diter) {
                    if (diter->schema == snode) {
                        val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                LY_TREE_FOR(second->child, diter) {
                    if (diter->schema == snode) {
                        val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                if (!ly_strequal(val1, val2, 1)) {
                    return 0;
                }
            }
        }

        LOGVAL(ctx, LYE_DUPLIST, LY_VLOG_LYD, second, second->schema->name);
        return 1;

    default:
        LOGINT(ctx);
        return 1;
    }
}